

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrum.cpp
# Opt level: O1

void __thiscall Timidity::Instrument::~Instrument(Instrument *this)

{
  int iVar1;
  BYTE *pBVar2;
  
  iVar1 = this->samples;
  if (iVar1 != 0) {
    pBVar2 = &this->sample->type;
    do {
      if ((*pBVar2 == '\0') && (*(sample_t **)(pBVar2 + -0x1c) != (sample_t *)0x0)) {
        free(*(sample_t **)(pBVar2 + -0x1c));
      }
      pBVar2 = pBVar2 + 0x68;
      iVar1 = iVar1 + -1;
    } while (iVar1 != 0);
  }
  free(this->sample);
  return;
}

Assistant:

Instrument::~Instrument()
{
	Sample *sp;
	int i;

	for (i = samples, sp = &(sample[0]); i != 0; i--, sp++)
	{
		if (sp->type == INST_GUS && sp->data != NULL)
		{
			free(sp->data);
		}
	}
	free(sample);
}